

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_uint * nk_find_value(nk_window *win,nk_hash name)

{
  uint local_2c;
  uint size;
  uint i;
  nk_table *iter;
  nk_hash name_local;
  nk_window *win_local;
  
  _size = win->tables;
  do {
    if (_size == (nk_table *)0x0) {
      return (nk_uint *)0x0;
    }
    for (local_2c = 0; local_2c < _size->size; local_2c = local_2c + 1) {
      if (_size->keys[local_2c] == name) {
        _size->seq = win->seq;
        return _size->values + local_2c;
      }
    }
    _size = _size->next;
  } while( true );
}

Assistant:

NK_LIB nk_uint*
nk_find_value(struct nk_window *win, nk_hash name)
{
    struct nk_table *iter = win->tables;
    while (iter) {
        unsigned int i = 0;
        unsigned int size = iter->size;
        for (i = 0; i < size; ++i) {
            if (iter->keys[i] == name) {
                iter->seq = win->seq;
                return &iter->values[i];
            }
        } size = NK_VALUE_PAGE_CAPACITY;
        iter = iter->next;
    }
    return 0;
}